

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::HttpHeaders::clone(HttpHeaders *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ulong uVar1;
  StringPtr *pSVar2;
  Header *pHVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  StringPtr SVar7;
  StringPtr str;
  StringPtr str_00;
  
  HttpHeaders(this,*(HttpHeaderTable **)__fn);
  lVar5 = *(long *)(__fn + 0x10);
  lVar4 = 8;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    uVar1 = *(ulong *)(*(long *)(__fn + 8) + lVar4);
    if (1 < uVar1) {
      str.content.size_ = uVar1;
      str.content.ptr = *(char **)(*(long *)(__fn + 8) + -8 + lVar4);
      SVar7 = cloneToOwn(this,str);
      pSVar2 = (this->indexedHeaders).ptr;
      *(char **)((long)pSVar2 + lVar4 + -8) = SVar7.content.ptr;
      *(size_t *)((long)&(pSVar2->content).ptr + lVar4) = SVar7.content.size_;
    }
    lVar4 = lVar4 + 0x10;
  }
  Vector<kj::HttpHeaders::Header>::resize
            (&this->unindexedHeaders,*(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) >> 5);
  lVar5 = *(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) >> 5;
  lVar4 = 0;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    SVar7.content.size_ = *(size_t *)(*(long *)(__fn + 0x20) + 8 + lVar4);
    SVar7.content.ptr = *(char **)(*(long *)(__fn + 0x20) + lVar4);
    SVar7 = cloneToOwn(this,SVar7);
    pHVar3 = (this->unindexedHeaders).builder.ptr;
    *(char **)((long)&(pHVar3->name).content.ptr + lVar4) = SVar7.content.ptr;
    *(size_t *)((long)&(pHVar3->name).content.size_ + lVar4) = SVar7.content.size_;
    str_00.content.size_ = *(size_t *)(*(long *)(__fn + 0x20) + 0x18 + lVar4);
    str_00.content.ptr = *(char **)(*(long *)(__fn + 0x20) + 0x10 + lVar4);
    SVar7 = cloneToOwn(this,str_00);
    pHVar3 = (this->unindexedHeaders).builder.ptr;
    *(char **)((long)&(pHVar3->value).content.ptr + lVar4) = SVar7.content.ptr;
    *(size_t *)((long)&(pHVar3->value).content.size_ + lVar4) = SVar7.content.size_;
    lVar4 = lVar4 + 0x20;
  }
  return (int)this;
}

Assistant:

HttpHeaders HttpHeaders::clone() const {
  HttpHeaders result(*table);

  for (auto i: kj::indices(indexedHeaders)) {
    if (indexedHeaders[i] != nullptr) {
      result.indexedHeaders[i] = result.cloneToOwn(indexedHeaders[i]);
    }
  }

  result.unindexedHeaders.resize(unindexedHeaders.size());
  for (auto i: kj::indices(unindexedHeaders)) {
    result.unindexedHeaders[i].name = result.cloneToOwn(unindexedHeaders[i].name);
    result.unindexedHeaders[i].value = result.cloneToOwn(unindexedHeaders[i].value);
  }

  return result;
}